

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O2

void wallet::init_tests::walletinit_verify_walletdir_no_trailing2_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_718;
  pointer local_710;
  char *local_708;
  char *local_700;
  pointer local_6f8;
  pointer local_6f0;
  char *local_6e8;
  char *local_6e0;
  pointer local_6d8;
  pointer local_6d0;
  char *local_6c8;
  char *local_6c0;
  pointer local_6b8;
  pointer local_6b0;
  char *local_6a8;
  char *local_6a0;
  pointer local_698;
  pointer local_690;
  char *local_688;
  char *local_680;
  basic_wrap_stringstream<char> local_678;
  walletinit_verify_walletdir_no_trailing2 t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_680 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"walletinit_verify_walletdir_no_trailing2");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_698 = (pbVar3->_M_dataplus)._M_p;
  local_690 = local_698 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x4c;
  file.m_begin = (iterator)&local_688;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_698,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  walletinit_verify_walletdir_no_trailing2::walletinit_verify_walletdir_no_trailing2(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6a0 = "";
  memset(&local_678,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_678);
  std::operator<<((ostream *)&local_678,'\"');
  std::operator<<((ostream *)&local_678,"walletinit_verify_walletdir_no_trailing2");
  std::operator<<((ostream *)&local_678,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_678);
  local_6b8 = (pbVar3->_M_dataplus)._M_p;
  local_6b0 = local_6b8 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x4c;
  file_00.m_begin = (iterator)&local_6a8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_6b8,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_678);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6c0 = "";
  memset(&local_678,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_678);
  std::operator<<((ostream *)&local_678,'\"');
  std::operator<<((ostream *)&local_678,"walletinit_verify_walletdir_no_trailing2");
  std::operator<<((ostream *)&local_678,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_678);
  local_6d8 = (pbVar3->_M_dataplus)._M_p;
  local_6d0 = local_6d8 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x4c;
  file_01.m_begin = (iterator)&local_6c8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6d8,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_678);
  walletinit_verify_walletdir_no_trailing2::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6e0 = "";
  memset(&local_678,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_678);
  std::operator<<((ostream *)&local_678,'\"');
  std::operator<<((ostream *)&local_678,"walletinit_verify_walletdir_no_trailing2");
  std::operator<<((ostream *)&local_678,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_678);
  local_6f8 = (pbVar3->_M_dataplus)._M_p;
  local_6f0 = local_6f8 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x4c;
  file_02.m_begin = (iterator)&local_6e8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6f8,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_678);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_700 = "";
  memset(&local_678,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_678);
  std::operator<<((ostream *)&local_678,'\"');
  std::operator<<((ostream *)&local_678,"walletinit_verify_walletdir_no_trailing2");
  std::operator<<((ostream *)&local_678,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_678);
  local_718 = (pbVar3->_M_dataplus)._M_p;
  local_710 = local_718 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x4c;
  file_03.m_begin = (iterator)&local_708;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_718,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_678);
  InitWalletDirTestingSetup::~InitWalletDirTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_no_trailing2)
{
    SetWalletDir(m_walletdir_path_cases["trailing2"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}